

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void duckdb_je_arena_dalloc_small(tsdn_t *tsdn,void *ptr)

{
  uint64_t *puVar1;
  ulong *puVar2;
  size_t *psVar3;
  uint32_t uVar4;
  arena_t *arena;
  _Bool _Var5;
  undefined1 delay_trigger;
  bin_t *pbVar6;
  ulong uVar7;
  tsdn_t *tsdn_00;
  uintptr_t in_R8;
  uint uVar8;
  bin_t *bin;
  uint uVar9;
  ulong uVar10;
  rtree_t *rtree;
  ulong uVar11;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    rtree = (rtree_t *)&rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
  }
  else {
    rtree = (rtree_t *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read(&local_1c8,tsdn,rtree,(rtree_ctx_t *)ptr,in_R8);
  uVar10 = (local_1c8.edata)->e_bits;
  arena = (arena_t *)duckdb_je_arenas[(uint)uVar10 & 0xfff].repr;
  uVar7 = uVar10 >> 0x14 & 0xff;
  uVar8 = (uint)(uVar10 >> 0x26) & 0x3f;
  uVar9 = (uint)uVar7;
  uVar11 = (ulong)(uVar9 * 4);
  uVar10 = (ulong)(uVar8 << 8);
  if (uVar9 < duckdb_je_bin_info_nbatched_sizes) {
    uVar10 = (ulong)uVar8 * 0x288;
  }
  bin = (bin_t *)((long)&arena->nthreads[0].repr +
                 uVar10 + *(uint *)((long)duckdb_je_arena_bin_offsets + uVar11));
  tsdn_00 = tsdn;
  malloc_mutex_lock(tsdn,(malloc_mutex_t *)bin);
  uVar10 = ((long)ptr - (long)(local_1c8.edata)->e_addr) *
           (ulong)*(uint *)((long)&duckdb_je_arena_binind_div_info[0].magic + uVar11);
  puVar2 = (ulong *)((long)&(local_1c8.edata)->field_6 + (uVar10 >> 0x26) * 8);
  *puVar2 = *puVar2 ^ 1L << ((byte)(uVar10 >> 0x20) & 0x3f);
  uVar10 = (local_1c8.edata)->e_bits + 0x10000000;
  (local_1c8.edata)->e_bits = uVar10;
  uVar9 = (uint)(uVar10 >> 0x1c) & 0x3ff;
  delay_trigger = 0xc0;
  uVar4 = duckdb_je_bin_infos[uVar7].nregs;
  if (uVar9 == uVar4) {
    pbVar6 = bin;
    duckdb_je_arena_dalloc_bin_locked_handle_newly_empty(tsdn_00,arena,local_1c8.edata,bin);
    delay_trigger = SUB81(pbVar6,0);
  }
  else if ((uVar9 == 1) && (bin->slabcur != local_1c8.edata)) {
    pbVar6 = bin;
    duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty(tsdn_00,arena,local_1c8.edata,bin);
    delay_trigger = SUB81(pbVar6,0);
  }
  puVar1 = &(bin->stats).ndalloc;
  *puVar1 = *puVar1 + 1;
  psVar3 = &(bin->stats).curregs;
  *psVar3 = *psVar3 - 1;
  (bin->lock).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x48));
  if (uVar9 == uVar4) {
    duckdb_je_arena_slab_dalloc(tsdn,arena,local_1c8.edata);
  }
  if (tsdn != (tsdn_t *)0x0) {
    _Var5 = ticker_geom_ticks(&(tsdn->tsd).
                               cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                              ,&(tsdn->tsd).
                                cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state,
                              (uint)('\0' < (tsdn->tsd).
                                            cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level
                                    ),(_Bool)delay_trigger);
    if (_Var5) {
      duckdb_je_arena_decay(tsdn,arena,false,false);
    }
  }
  return;
}

Assistant:

void
arena_dalloc_small(tsdn_t *tsdn, void *ptr) {
	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	arena_t *arena = arena_get_from_edata(edata);

	arena_dalloc_bin(tsdn, arena, edata, ptr);
	arena_decay_tick(tsdn, arena);
}